

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileNameSanitizerFactory.cpp
# Opt level: O1

bool ApprovalTests::FileNameSanitizerFactory::isForbidden(char c)

{
  int iVar1;
  long lVar2;
  
  if (isForbidden(char)::forbiddenChars_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&isForbidden(char)::forbiddenChars_abi_cxx11_);
    if (iVar1 != 0) {
      isForbidden(char)::forbiddenChars_abi_cxx11_._M_dataplus._M_p =
           (pointer)&isForbidden(char)::forbiddenChars_abi_cxx11_.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&isForbidden(char)::forbiddenChars_abi_cxx11_,"\\/:?\"<>|\' ","");
      __cxa_atexit(::std::__cxx11::string::~string,&isForbidden(char)::forbiddenChars_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&isForbidden(char)::forbiddenChars_abi_cxx11_);
    }
  }
  lVar2 = ::std::__cxx11::string::find(-0x38,(ulong)(uint)(int)c);
  return lVar2 != -1;
}

Assistant:

bool FileNameSanitizerFactory::isForbidden(char c)
    {
        static std::string forbiddenChars("\\/:?\"<>|' ");
        return std::string::npos != forbiddenChars.find(c);
    }